

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O1

void __thiscall prevector_tests::PrevectorTestInt::test_method(PrevectorTestInt *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  ulong uVar2;
  Size s;
  size_type new_capacity;
  prevector_tester<8U,_int> *ppVar3;
  realtype values_00;
  void *pvVar4;
  pointer piVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  prevector_tester<8U,_int> *ppVar10;
  uint64_t uVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  EVP_PKEY_CTX *src;
  FastRandomContext *rng;
  ulong unaff_RBP;
  EVP_PKEY_CTX *dst;
  int iVar15;
  int iVar16;
  vector<int,_std::allocator<int>_> *pvVar17;
  uint uVar18;
  int iVar19;
  int *v;
  vector<int,_std::allocator<int>_> *pvVar20;
  pointer piVar21;
  prevector_tester<8U,_int> *this_00;
  long in_FS_OFFSET;
  int values [4];
  prevector_tester<8U,_int> test;
  undefined8 in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee8;
  pointer local_108;
  allocator_type local_f9;
  vector<int,_std::allocator<int>_> local_f8;
  prevector_tester<8U,_int> local_e0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  rng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.super_BasicTestingSetup.
         m_rng;
  uVar6 = 0;
  do {
    prevector_tester<8U,_int>::prevector_tester(&local_e0,rng);
    iVar15 = 0;
    do {
      pvVar17 = &local_f8;
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,2)
      ;
      if (uVar7 == 0) {
        uVar8 = (ulong)((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar18 = (uint)uVar8;
        if (uVar18 == 0) {
          uVar12 = 0x20;
        }
        else {
          uVar12 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar12 = uVar12 ^ 0x1f;
        }
        pvVar20 = (vector<int,_std::allocator<int>_> *)(uVar8 & 0xffffffff);
        unaff_RBP = (ulong)(0x20 - uVar12);
        do {
          pvVar9 = (vector<int,_std::allocator<int>_> *)
                   RandomMixin<FastRandomContext>::randbits
                             (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar12);
          pvVar1 = pvVar17;
          if (pvVar9 <= pvVar20) {
            pvVar1 = pvVar9;
          }
          pvVar17 = (vector<int,_std::allocator<int>_> *)((ulong)pvVar1 & 0xffffffff);
        } while (pvVar20 < pvVar9);
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar7;
        prevector_tester<8U,_int>::insert(&local_e0,(Size)pvVar1,(int *)&local_f8);
      }
      if (((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        if (uVar7 == 1) {
          uVar18 = (int)((ulong)((long)local_e0.real_vector.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)local_e0.real_vector.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2) - 1;
          if (uVar18 == 0) {
            uVar12 = 0x20;
          }
          else {
            uVar12 = 0x1f;
            if (uVar18 != 0) {
              for (; uVar18 >> uVar12 == 0; uVar12 = uVar12 - 1) {
              }
            }
            uVar12 = uVar12 ^ 0x1f;
          }
          do {
            uVar7 = RandomMixin<FastRandomContext>::randbits
                              (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar12);
            uVar8 = unaff_RBP;
            if (uVar7 <= uVar18) {
              uVar8 = uVar7;
            }
            unaff_RBP = uVar8 & 0xffffffff;
          } while (uVar18 < uVar7);
          prevector_tester<8U,_int>::erase(&local_e0,(Size)uVar8);
        }
      }
      pvVar17 = &local_f8;
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar7 == 2) {
        uVar8 = (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        do {
          uVar7 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,3);
          uVar2 = unaff_RBP;
          if (4 >= uVar7) {
            uVar2 = uVar7;
          }
          unaff_RBP = uVar2 & 0xffffffff;
        } while (4 < uVar7);
        uVar12 = (int)uVar2 + (int)(uVar8 >> 2);
        unaff_RBP = (ulong)uVar12;
        uVar18 = 2;
        if (2 < (int)uVar12) {
          uVar18 = uVar12;
        }
        s = uVar18 - 2;
        if (0x1f < (int)uVar12) {
          s = 0x1e;
        }
        prevector_tester<8U,_int>::resize(&local_e0,s);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar7 == 3) {
        uVar8 = (ulong)((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar18 = (uint)uVar8;
        if (uVar18 == 0) {
          uVar12 = 0x20;
        }
        else {
          uVar12 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar12 = uVar12 ^ 0x1f;
        }
        pvVar20 = (vector<int,_std::allocator<int>_> *)(uVar8 & 0xffffffff);
        do {
          pvVar9 = (vector<int,_std::allocator<int>_> *)
                   RandomMixin<FastRandomContext>::randbits
                             (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar12);
          pvVar1 = pvVar17;
          if (pvVar9 <= pvVar20) {
            pvVar1 = pvVar9;
          }
          pvVar17 = (vector<int,_std::allocator<int>_> *)((ulong)pvVar1 & 0xffffffff);
        } while (pvVar20 < pvVar9);
        uVar7 = RandomMixin<FastRandomContext>::randbits<1>
                          (&rng->super_RandomMixin<FastRandomContext>);
        uVar18 = 2 - (uVar7 == 0);
        unaff_RBP = (ulong)uVar18;
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar7;
        prevector_tester<8U,_int>::insert(&local_e0,(Size)pvVar1,uVar18,(int *)&local_f8);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar7 == 4) {
        uVar8 = (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        uVar7 = RandomMixin<FastRandomContext>::randbits<1>
                          (&rng->super_RandomMixin<FastRandomContext>);
        iVar16 = 2 - (uint)(uVar7 == 0);
        iVar19 = (int)(uVar8 >> 2);
        if (iVar19 <= iVar16) {
          iVar16 = iVar19;
        }
        uVar18 = (int)((ulong)((long)local_e0.real_vector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)local_e0.real_vector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) - iVar16;
        if (uVar18 == 0) {
          uVar12 = 0x20;
        }
        else {
          uVar12 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar12 = uVar12 ^ 0x1f;
        }
        do {
          uVar7 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar12);
          uVar8 = unaff_RBP;
          if (uVar7 <= uVar18) {
            uVar8 = uVar7;
          }
          unaff_RBP = uVar8 & 0xffffffff;
        } while (uVar18 < uVar7);
        prevector_tester<8U,_int>::erase(&local_e0,(Size)uVar8,iVar16 + (Size)uVar8);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,4)
      ;
      if (uVar7 == 5) {
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar7;
        prevector_tester<8U,_int>::push_back(&local_e0,(int *)&local_f8);
      }
      if (((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,4);
        if (uVar7 == 6) {
          prevector_tester<8U,_int>::pop_back(&local_e0);
        }
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar7 == 7) {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        uVar18 = (uint)uVar7 + 1;
        if ((uint)uVar7 < 0x7fffffff) {
          uVar8 = 0;
          do {
            uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                              (&rng->super_RandomMixin<FastRandomContext>);
            *(int *)((long)&local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar8 * 4) = (int)uVar7;
            uVar8 = uVar8 + 1;
          } while (uVar18 != uVar8);
        }
        uVar8 = (ulong)((long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2;
        uVar12 = (uint)uVar8;
        if (uVar12 == 0) {
          uVar13 = 0x20;
        }
        else {
          uVar13 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = uVar13 ^ 0x1f;
        }
        uVar8 = uVar8 & 0xffffffff;
        do {
          uVar7 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar13);
          uVar2 = unaff_RBP;
          if (uVar7 <= uVar8) {
            uVar2 = uVar7;
          }
          unaff_RBP = uVar2 & 0xffffffff;
        } while (uVar8 < uVar7);
        prevector_tester<8u,int>::insert_range<int*>
                  ((prevector_tester<8u,int> *)&local_e0,(Size)uVar2,(int *)&local_f8,
                   (int *)((long)&local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + (long)(int)uVar18 * 4));
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar7 == 8) {
        uVar8 = (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,2);
        iVar16 = (int)uVar7 + 1;
        iVar19 = (int)(uVar8 >> 2);
        if (iVar19 <= iVar16) {
          iVar16 = iVar19;
        }
        uVar18 = (int)((ulong)((long)local_e0.real_vector.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)local_e0.real_vector.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2) - iVar16;
        if (uVar18 == 0) {
          uVar12 = 0x20;
        }
        else {
          uVar12 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar12 = uVar12 ^ 0x1f;
        }
        do {
          uVar7 = RandomMixin<FastRandomContext>::randbits
                            (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar12);
          uVar8 = unaff_RBP;
          if (uVar7 <= uVar18) {
            uVar8 = uVar7;
          }
          unaff_RBP = uVar8 & 0xffffffff;
        } while (uVar18 < uVar7);
        prevector_tester<8U,_int>::erase(&local_e0,(Size)uVar8,iVar16 + (Size)uVar8);
      }
      this_00 = &local_e0;
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar7 == 9) {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,5);
        prevector_tester<8U,_int>::reserve(this_00,(Size)uVar7);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,6)
      ;
      if (uVar7 == 10) {
        new_capacity = local_e0.pre_vector._size - 9;
        if (local_e0.pre_vector._size < 9) {
          new_capacity = local_e0.pre_vector._size;
        }
        prevector<8U,_int,_unsigned_int,_int>::change_capacity(&local_e0.pre_vector,new_capacity);
        prevector_tester<8U,_int>::test(this_00);
      }
      iVar16 = (int)((ulong)((long)local_e0.real_vector.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
      if (iVar16 != 0) {
        uVar18 = iVar16 - 1;
        if (uVar18 == 0) {
          uVar12 = 0x20;
        }
        else {
          uVar12 = 0x1f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar12 = uVar12 ^ 0x1f;
        }
        unaff_RBP = (ulong)(0x20 - uVar12);
        do {
          ppVar10 = (prevector_tester<8U,_int> *)
                    RandomMixin<FastRandomContext>::randbits
                              (&rng->super_RandomMixin<FastRandomContext>,0x20 - uVar12);
          ppVar3 = this_00;
          if (ppVar10 <= (prevector_tester<8U,_int> *)(ulong)uVar18) {
            ppVar3 = ppVar10;
          }
          this_00 = (prevector_tester<8U,_int> *)((ulong)ppVar3 & 0xffffffff);
        } while ((prevector_tester<8U,_int> *)(ulong)uVar18 < ppVar10);
        uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                          (&rng->super_RandomMixin<FastRandomContext>);
        local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)this_00] = (int)uVar7;
        uVar14 = &local_e0.pre_vector;
        if (8 < local_e0.pre_vector._size) {
          uVar14 = local_e0.pre_vector._union.indirect_contents.indirect;
        }
        *(int *)((long)&((pretype *)uVar14)->_union + (long)(int)ppVar3 * 4) = (int)uVar7;
        prevector_tester<8U,_int>::test(&local_e0);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits
                        (&rng->super_RandomMixin<FastRandomContext>,10);
      if (uVar7 == 0xb) {
        if (local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_e0.real_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        prevector<8U,_int,_unsigned_int,_int>::resize(&local_e0.pre_vector,0);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,9)
      ;
      if (uVar7 == 0xc) {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,5);
        uVar11 = RandomMixin<FastRandomContext>::randbits<32>
                           (&rng->super_RandomMixin<FastRandomContext>);
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = (undefined4)uVar11;
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  (&local_e0.real_vector,uVar7 & 0xffffffff,(value_type_conflict2 *)&local_f8);
        prevector<8U,_int,_unsigned_int,_int>::assign
                  (&local_e0.pre_vector,(size_type)uVar7,(int *)&local_f8);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,3)
      ;
      if (uVar7 == 3) {
        prevector_tester<8U,_int>::swap(&local_e0);
      }
      dst = (EVP_PKEY_CTX *)0x4;
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,4)
      ;
      if (uVar7 == 8) {
        prevector_tester<8U,_int>::copy(&local_e0,dst,src);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar7 == 0x12) {
        prevector_tester<8U,_int>::move(&local_e0);
      }
      uVar7 = RandomMixin<FastRandomContext>::randbits(&rng->super_RandomMixin<FastRandomContext>,5)
      ;
      if (uVar7 == 0x13) {
        uVar7 = RandomMixin<FastRandomContext>::randbits
                          (&rng->super_RandomMixin<FastRandomContext>,4);
        std::vector<int,_std::allocator<int>_>::vector(&local_f8,(ulong)((int)uVar7 + 1),&local_f9);
        piVar5 = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar21 = (pointer)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start._0_4_);
            piVar21 != piVar5; piVar21 = piVar21 + 1) {
          uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                            (&rng->super_RandomMixin<FastRandomContext>);
          *piVar21 = (int)uVar7;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffee8,&local_f8);
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)uVar6;
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)in_stack_fffffffffffffed8;
        values_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = in_stack_fffffffffffffee8;
        prevector_tester<8U,_int>::resize_uninitialized(&local_e0,values_00);
        if (in_stack_fffffffffffffee8 != (pointer)0x0) {
          operator_delete(in_stack_fffffffffffffee8,
                          (long)local_108 - (long)in_stack_fffffffffffffee8);
        }
        pvVar4 = (void *)CONCAT44(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_);
        if (pvVar4 != (void *)0x0) {
          operator_delete(pvVar4,(long)local_f8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar4);
        }
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 != 0x800);
    prevector_tester<8U,_int>::~prevector_tester(&local_e0);
    uVar18 = (int)uVar6 + 1;
    uVar6 = (ulong)uVar18;
  } while (uVar18 != 0x40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(PrevectorTestInt)
{
    for (int j = 0; j < 64; j++) {
        prevector_tester<8, int> test{m_rng};
        for (int i = 0; i < 2048; i++) {
            if (m_rng.randbits(2) == 0) {
                test.insert(m_rng.randrange(test.size() + 1), int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(2) == 1) {
                test.erase(m_rng.randrange(test.size()));
            }
            if (m_rng.randbits(3) == 2) {
                int new_size = std::max(0, std::min(30, (int)test.size() + (int)m_rng.randrange(5) - 2));
                test.resize(new_size);
            }
            if (m_rng.randbits(3) == 3) {
                test.insert(m_rng.randrange(test.size() + 1), 1 + m_rng.randbool(), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 4) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbool()));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(4) == 5) {
                test.push_back(int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(4) == 6) {
                test.pop_back();
            }
            if (m_rng.randbits(5) == 7) {
                int values[4];
                int num = 1 + (m_rng.randbits(2));
                for (int k = 0; k < num; k++) {
                    values[k] = int(m_rng.rand32());
                }
                test.insert_range(m_rng.randrange(test.size() + 1), values, values + num);
            }
            if (m_rng.randbits(5) == 8) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbits(2)));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(5) == 9) {
                test.reserve(m_rng.randbits(5));
            }
            if (m_rng.randbits(6) == 10) {
                test.shrink_to_fit();
            }
            if (test.size() > 0) {
                test.update(m_rng.randrange(test.size()), int(m_rng.rand32()));
            }
            if (m_rng.randbits(10) == 11) {
                test.clear();
            }
            if (m_rng.randbits(9) == 12) {
                test.assign(m_rng.randbits(5), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 3) {
                test.swap();
            }
            if (m_rng.randbits(4) == 8) {
                test.copy();
            }
            if (m_rng.randbits(5) == 18) {
                test.move();
            }
            if (m_rng.randbits(5) == 19) {
                unsigned int num = 1 + (m_rng.randbits(4));
                std::vector<int> values(num);
                for (int& v : values) {
                    v = int(m_rng.rand32());
                }
                test.resize_uninitialized(values);
            }
        }
    }
}